

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_starttls_resp(Curl_easy *data,connectdata *conn,int pop3code,pop3state instate)

{
  CURLcode local_2c;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_2c = CURLE_OK;
  if ((data->conn->proto).ftpc.pp.overflow == 0) {
    if (pop3code == 0x2b) {
      pop3_state(data,POP3_UPGRADETLS);
    }
    else if ((data->set).use_ssl == '\x01') {
      local_2c = pop3_perform_authentication(data,conn);
    }
    else {
      Curl_failf(data,"STARTTLS denied");
      local_2c = CURLE_USE_SSL_FAILED;
    }
    data_local._4_4_ = local_2c;
  }
  else {
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_state_starttls_resp(struct Curl_easy *data,
                                         struct connectdata *conn,
                                         int pop3code,
                                         pop3state instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  /* Pipelining in response is forbidden. */
  if(data->conn->proto.pop3c.pp.overflow)
    return CURLE_WEIRD_SERVER_REPLY;

  if(pop3code != '+') {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied");
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = pop3_perform_authentication(data, conn);
  }
  else
    pop3_state(data, POP3_UPGRADETLS);

  return result;
}